

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

void ON_Sort(sort_algorithm method,uint *index,void *data,size_t count,size_t sizeof_element,
            _func_int_void_ptr_void_ptr_void_ptr *compar,void *p)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int local_88;
  uint local_60;
  void *local_50;
  void *local_48;
  undefined8 local_40;
  _func_int_void_ptr_void_ptr_void_ptr *local_38;
  
  if (sizeof_element == 0 || (index == (uint *)0x0 || count == 0)) {
    return;
  }
  if (count == 1) {
    *index = 0;
    return;
  }
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    local_88 = (int)count;
    local_60 = (uint)sizeof_element;
    if (local_88 == (int)lVar3) break;
    index[lVar3] = uVar4;
    uVar4 = uVar4 + local_60;
    lVar3 = lVar3 + 1;
  }
  local_40 = 0;
  local_50 = p;
  local_48 = data;
  local_38 = compar;
  if (method != quick_sort) {
    uVar7 = count >> 1 & 0x7fffffff;
    uVar4 = local_88 - 1;
LAB_00506bf9:
    if ((int)uVar7 == 0) {
      uVar6 = index[uVar4];
      index[uVar4] = *index;
      uVar7 = 0;
      uVar4 = uVar4 - 1;
      if (uVar4 == 0) goto LAB_00506cdd;
    }
    else {
      uVar7 = (ulong)((int)uVar7 - 1);
      uVar6 = index[uVar7];
    }
    uVar8 = uVar7;
    do {
      uVar1 = (int)uVar8 * 2;
      do {
        uVar5 = uVar1 + 1;
        if (uVar4 < uVar5) {
          index[uVar8] = uVar6;
          goto LAB_00506bf9;
        }
        if ((uVar5 < uVar4) &&
           (iVar2 = (*compar)((void *)((ulong)index[uVar5] + (long)data),
                              (void *)((ulong)index[(ulong)uVar5 + 1] + (long)data),p), iVar2 < 0))
        {
          uVar5 = uVar1 + 2;
        }
        iVar2 = (*compar)((void *)((ulong)uVar6 + (long)data),
                          (void *)((ulong)index[uVar5] + (long)data),p);
        uVar1 = uVar4;
      } while (-1 < iVar2);
      index[uVar8] = index[uVar5];
      uVar8 = (ulong)uVar5;
    } while( true );
  }
  ON_qsort(index,count,4,qicompar3,&local_50);
LAB_00506ce4:
  for (lVar3 = 0; local_88 != (int)lVar3; lVar3 = lVar3 + 1) {
    index[lVar3] = index[lVar3] / local_60;
  }
  return;
LAB_00506cdd:
  *index = uVar6;
  goto LAB_00506ce4;
}

Assistant:

void
ON_Sort( ON::sort_algorithm method, 
  unsigned int* index, 
  const void* data, 
  size_t count, 
  size_t sizeof_element, 
  int (*compar)(const void*,const void*,void*),
  void* p
  )
{
  tagON_SORT_CONTEXT context;
  unsigned int* idx;
  const void* tmp;
  unsigned int i, j, k, tmpi, icount, isizeof_element;
  
  if (count < 1 || 0 == index || sizeof_element <= 0) 
  {
    return;
  }
  if (1 == count) 
  {
    index[0]=0;
    return;
  }

  isizeof_element = (unsigned int)sizeof_element; // (int) converts 64 bit size_t
  icount = (unsigned int)count;
  idx = index;
  
  for ( i = 0; icount--; i += isizeof_element )
  {
    *idx++ = i;
  }

  memset(&context,0,sizeof(context));
  context.users_context = p;
  context.qdata = (const unsigned char*)data;
  context.compar3 = compar;
  idx = index;
  if ( ON::sort_algorithm::quick_sort == method )
  {
    ON_qsort(idx,count,sizeof(idx[0]),qicompar3,&context);
  }
  else
  {
    // heap sort
    icount = (unsigned int)count;

    k = icount >> 1;
    icount--;
    for (;;) 
    {
      if (k) 
      {
        tmpi = idx[--k];
        tmp  = context.qdata + tmpi;
      }
      else 
      {
        tmpi = idx[icount];
        tmp  = context.qdata + tmpi;
        idx[icount] = idx[0];
        if (!(--icount)) 
        {
          idx[0] = tmpi;
          break;
        }
      }
      i = k;
      j = (k<<1) + 1;
      while (j <= icount) 
      {
        if (j < icount && context.compar3(context.qdata + idx[j], context.qdata + idx[j+1], context.users_context) < 0) 
        {
          j++;
        }
        if (context.compar3(tmp,context.qdata + idx[j], context.users_context) < 0) 
        {
          idx[i] = idx[j];
          i = j;
          j = (j<<1) + 1;
        } 
        else 
        {
          j = icount + 1;
        }
      }
      idx[i] = tmpi;
    }
  }

  for (i = (unsigned int)count; i--; idx++ )
  {
    *idx /= isizeof_element;
  }
}